

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIncludeCommand.cxx
# Opt level: O0

bool cmIncludeCommand(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *args,cmExecutionStatus *status)

{
  MessageType t;
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  mapped_type *pmVar5;
  size_type sVar6;
  const_reference pvVar7;
  ulong uVar8;
  cmMakefile *pcVar9;
  pointer ppVar10;
  string *psVar11;
  cmGlobalGenerator *this;
  ostream *poVar12;
  PolicyID id;
  PolicyID id_00;
  char *local_8b0;
  cmAlphaNum local_728;
  cmAlphaNum local_6f8;
  undefined1 local_6c8 [8];
  string m;
  undefined1 local_690 [7];
  bool readit;
  cmAlphaNum local_660;
  string local_630;
  cmAlphaNum local_610;
  cmAlphaNum local_5e0;
  string local_5b0;
  string_view local_590;
  byte local_57a;
  byte local_579;
  undefined1 local_578 [6];
  bool fileIsDirectory;
  bool fileDoesnotExist;
  string listFile;
  string local_538;
  MessageType local_514;
  undefined1 local_510 [4];
  MessageType messageType;
  ostringstream e;
  char *local_398;
  char *modal;
  cmGlobalGenerator *gg;
  string fname_abs;
  string local_338;
  cmAlphaNum local_318;
  string local_2e8;
  PolicyStatus local_2c4;
  iterator iStack_2c0;
  PolicyStatus PolicyStatus;
  _Self local_2b8;
  iterator ModulePolicy;
  string mfile;
  cmAlphaNum local_260;
  undefined1 local_230 [8];
  string module;
  undefined1 local_208 [6];
  bool system;
  cmAlphaNum local_1e8;
  cmAlphaNum local_1b8;
  undefined1 local_188 [8];
  string errorText;
  string local_160;
  allocator<char> local_139;
  string local_138;
  int local_118;
  allocator<char> local_111;
  string local_110;
  uint local_ec;
  undefined1 local_e8 [4];
  uint i;
  string resultVarName;
  string fname;
  undefined1 local_a0 [5];
  bool noPolicyScope;
  bool optional;
  allocator<char> local_79;
  key_type local_78;
  allocator<char> local_41;
  key_type local_40;
  cmExecutionStatus *local_20;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  local_20 = status;
  status_local = (cmExecutionStatus *)args;
  if ((cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::DeprecatedModules_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::DeprecatedModules_abi_cxx11_), iVar3 != 0)) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
    ::map(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
           ::DeprecatedModules_abi_cxx11_);
    __cxa_atexit(std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                 ::~map,&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::DeprecatedModules_abi_cxx11_);
  }
  bVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
          ::empty(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                   ::DeprecatedModules_abi_cxx11_);
  if (bVar2) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Documentation",&local_41);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::DeprecatedModules_abi_cxx11_,&local_40);
    *pmVar5 = CMP0106;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"WriteCompilerDetectionHeader",&local_79);
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::operator[](&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                           ::DeprecatedModules_abi_cxx11_,&local_78);
    *pmVar5 = CMP0120;
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
  }
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)status_local);
  if ((bVar2) ||
     (sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local), 4 < sVar6)) {
    pcVar1 = local_20;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_a0,
               "called with wrong number of arguments.  include() only takes one file.",
               (allocator<char> *)(fname.field_2._M_local_buf + 0xf));
    cmExecutionStatus::SetError(pcVar1,(string *)local_a0);
    std::__cxx11::string::~string((string *)local_a0);
    std::allocator<char>::~allocator((allocator<char> *)(fname.field_2._M_local_buf + 0xf));
    args_local._7_1_ = 0;
    goto LAB_004160fb;
  }
  fname.field_2._M_local_buf[0xe] = '\0';
  fname.field_2._M_local_buf[0xd] = '\0';
  pvVar7 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)status_local,0);
  std::__cxx11::string::string((string *)(resultVarName.field_2._M_local_buf + 8),(string *)pvVar7);
  std::__cxx11::string::string((string *)local_e8);
  for (local_ec = 1; uVar8 = (ulong)local_ec,
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)status_local), uVar8 < sVar6; local_ec = local_ec + 1) {
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)status_local,(ulong)local_ec);
    bVar2 = std::operator==(pvVar7,"OPTIONAL");
    pcVar1 = local_20;
    if (bVar2) {
      if ((fname.field_2._M_local_buf[0xe] & 1U) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_110,"called with invalid arguments: OPTIONAL used twice",
                   &local_111);
        cmExecutionStatus::SetError(pcVar1,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
        std::allocator<char>::~allocator(&local_111);
        args_local._7_1_ = 0;
        local_118 = 1;
        goto LAB_004160c7;
      }
      fname.field_2._M_local_buf[0xe] = '\x01';
    }
    else {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)status_local,(ulong)local_ec);
      bVar2 = std::operator==(pvVar7,"RESULT_VARIABLE");
      if (bVar2) {
        uVar8 = std::__cxx11::string::empty();
        pcVar1 = local_20;
        if ((uVar8 & 1) == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_138,
                     "called with invalid arguments: only one result variable allowed",&local_139);
          cmExecutionStatus::SetError(pcVar1,&local_138);
          std::__cxx11::string::~string((string *)&local_138);
          std::allocator<char>::~allocator(&local_139);
          args_local._7_1_ = 0;
          local_118 = 1;
          goto LAB_004160c7;
        }
        local_ec = local_ec + 1;
        uVar8 = (ulong)local_ec;
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)status_local);
        pcVar1 = local_20;
        if (sVar6 <= uVar8) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_160,"called with no value for RESULT_VARIABLE.",
                     (allocator<char> *)(errorText.field_2._M_local_buf + 0xf));
          cmExecutionStatus::SetError(pcVar1,&local_160);
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator
                    ((allocator<char> *)(errorText.field_2._M_local_buf + 0xf));
          args_local._7_1_ = 0;
          local_118 = 1;
          goto LAB_004160c7;
        }
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_ec);
        std::__cxx11::string::operator=((string *)local_e8,(string *)pvVar7);
      }
      else {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)status_local,(ulong)local_ec);
        bVar2 = std::operator==(pvVar7,"NO_POLICY_SCOPE");
        if (bVar2) {
          fname.field_2._M_local_buf[0xd] = '\x01';
        }
        else if (1 < local_ec) {
          cmAlphaNum::cmAlphaNum(&local_1b8,"called with invalid argument: ");
          pvVar7 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)status_local,(ulong)local_ec);
          cmAlphaNum::cmAlphaNum(&local_1e8,pvVar7);
          cmStrCat<>((string *)local_188,&local_1b8,&local_1e8);
          cmExecutionStatus::SetError(local_20,(string *)local_188);
          args_local._7_1_ = 0;
          local_118 = 1;
          std::__cxx11::string::~string((string *)local_188);
          goto LAB_004160c7;
        }
      }
    }
  }
  uVar8 = std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    bVar2 = cmsys::SystemTools::FileIsFullPath((string *)((long)&resultVarName.field_2 + 8));
    if (!bVar2) {
      module.field_2._M_local_buf[0xe] = '\0';
      cmAlphaNum::cmAlphaNum(&local_260,(string *)((long)&resultVarName.field_2 + 8));
      cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&mfile.field_2 + 8),".cmake");
      cmStrCat<>((string *)local_230,&local_260,(cmAlphaNum *)((long)&mfile.field_2 + 8));
      pcVar9 = cmExecutionStatus::GetMakefile(local_20);
      cmMakefile::GetModulesFile
                ((string *)&ModulePolicy,pcVar9,(string *)local_230,
                 (bool *)(module.field_2._M_local_buf + 0xe));
      if ((module.field_2._M_local_buf[0xe] & 1U) != 0) {
        local_2b8._M_node =
             (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
             ::find(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                     ::DeprecatedModules_abi_cxx11_,(key_type *)((long)&resultVarName.field_2 + 8));
        iStack_2c0 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>_>
                     ::end(&cmIncludeCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                            ::DeprecatedModules_abi_cxx11_);
        bVar2 = std::operator!=(&local_2b8,&stack0xfffffffffffffd40);
        if (bVar2) {
          pcVar9 = cmExecutionStatus::GetMakefile(local_20);
          ppVar10 = std::
                    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>
                    ::operator->(&local_2b8);
          local_2c4 = cmMakefile::GetPolicyStatus(pcVar9,ppVar10->second,false);
          if (local_2c4 != OLD) {
            if (local_2c4 == WARN) {
              pcVar9 = cmExecutionStatus::GetMakefile(local_20);
              ppVar10 = std::
                        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmPolicies::PolicyID>_>
                        ::operator->(&local_2b8);
              cmPolicies::GetPolicyWarning_abi_cxx11_
                        (&local_338,(cmPolicies *)(ulong)ppVar10->second,id);
              cmAlphaNum::cmAlphaNum(&local_318,&local_338);
              cmAlphaNum::cmAlphaNum((cmAlphaNum *)((long)&fname_abs.field_2 + 8),"\n");
              cmStrCat<>(&local_2e8,&local_318,(cmAlphaNum *)((long)&fname_abs.field_2 + 8));
              cmMakefile::IssueMessage(pcVar9,AUTHOR_WARNING,&local_2e8);
              std::__cxx11::string::~string((string *)&local_2e8);
              std::__cxx11::string::~string((string *)&local_338);
            }
            else if (local_2c4 - NEW < 3) {
              std::__cxx11::string::operator=((string *)&ModulePolicy,"");
            }
          }
        }
      }
      uVar8 = std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        std::__cxx11::string::operator=
                  ((string *)(resultVarName.field_2._M_local_buf + 8),(string *)&ModulePolicy);
      }
      std::__cxx11::string::~string((string *)&ModulePolicy);
      std::__cxx11::string::~string((string *)local_230);
    }
    pcVar9 = cmExecutionStatus::GetMakefile(local_20);
    psVar11 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar9);
    cmsys::SystemTools::CollapseFullPath
              ((string *)&gg,(string *)((long)&resultVarName.field_2 + 8),psVar11);
    pcVar9 = cmExecutionStatus::GetMakefile(local_20);
    this = cmMakefile::GetGlobalGenerator(pcVar9);
    bVar2 = cmGlobalGenerator::IsExportedTargetsFile(this,(string *)&gg);
    if (bVar2) {
      local_398 = (char *)0x0;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_510);
      local_514 = AUTHOR_WARNING;
      pcVar9 = cmExecutionStatus::GetMakefile(local_20);
      PVar4 = cmMakefile::GetPolicyStatus(pcVar9,CMP0024,false);
      if (PVar4 != OLD) {
        if (PVar4 == WARN) {
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_538,(cmPolicies *)0x18,id_00);
          poVar12 = std::operator<<((ostream *)local_510,(string *)&local_538);
          std::operator<<(poVar12,"\n");
          std::__cxx11::string::~string((string *)&local_538);
          local_398 = "should";
        }
        else if (PVar4 - NEW < 3) {
          local_398 = "may";
          local_514 = FATAL_ERROR;
        }
      }
      if (local_398 == (char *)0x0) {
LAB_00415c0b:
        cmGlobalGenerator::CreateGenerationObjects(this,AllTargets);
        cmGlobalGenerator::GenerateImportFile(this,(string *)&gg);
        local_118 = 0;
      }
      else {
        poVar12 = std::operator<<((ostream *)local_510,"The file\n  ");
        poVar12 = std::operator<<(poVar12,(string *)&gg);
        poVar12 = std::operator<<(poVar12,"\nwas generated by the export() command.  It ");
        poVar12 = std::operator<<(poVar12,local_398);
        std::operator<<(poVar12,
                        " not be used as the argument to the include() command.  Use ALIAS targets instead to refer to targets by alternative names.\n"
                       );
        pcVar9 = cmExecutionStatus::GetMakefile(local_20);
        t = local_514;
        std::__cxx11::ostringstream::str();
        cmMakefile::IssueMessage(pcVar9,t,(string *)((long)&listFile.field_2 + 8));
        std::__cxx11::string::~string((string *)(listFile.field_2._M_local_buf + 8));
        if (local_514 != FATAL_ERROR) goto LAB_00415c0b;
        args_local._7_1_ = 0;
        local_118 = 1;
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_510);
      if (local_118 == 0) goto LAB_00415c69;
    }
    else {
LAB_00415c69:
      pcVar9 = cmExecutionStatus::GetMakefile(local_20);
      psVar11 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar9);
      cmsys::SystemTools::CollapseFullPath
                ((string *)local_578,(string *)((long)&resultVarName.field_2 + 8),psVar11);
      bVar2 = cmsys::SystemTools::FileExists((string *)local_578);
      local_579 = ~bVar2 & 1;
      local_57a = cmsys::SystemTools::FileIsDirectory((string *)local_578);
      if (((local_579 & 1) != 0) || ((bool)local_57a)) {
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          pcVar9 = cmExecutionStatus::GetMakefile(local_20);
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    (&local_590,"NOTFOUND");
          cmMakefile::AddDefinition(pcVar9,(string *)local_e8,local_590);
        }
        pcVar1 = local_20;
        if ((fname.field_2._M_local_buf[0xe] & 1U) == 0) {
          if ((local_579 & 1) == 0) {
            if ((local_57a & 1) == 0) goto LAB_00415eef;
            cmAlphaNum::cmAlphaNum(&local_660,"requested file is a directory:\n  ");
            cmAlphaNum::cmAlphaNum
                      ((cmAlphaNum *)local_690,(string *)((long)&resultVarName.field_2 + 8));
            cmStrCat<>(&local_630,&local_660,(cmAlphaNum *)local_690);
            cmExecutionStatus::SetError(pcVar1,&local_630);
            std::__cxx11::string::~string((string *)&local_630);
            args_local._7_1_ = 0;
            local_118 = 1;
          }
          else {
            cmAlphaNum::cmAlphaNum(&local_5e0,"could not find requested file:\n  ");
            cmAlphaNum::cmAlphaNum(&local_610,(string *)((long)&resultVarName.field_2 + 8));
            cmStrCat<>(&local_5b0,&local_5e0,&local_610);
            cmExecutionStatus::SetError(pcVar1,&local_5b0);
            std::__cxx11::string::~string((string *)&local_5b0);
            args_local._7_1_ = 0;
            local_118 = 1;
          }
        }
        else {
          args_local._7_1_ = 1;
          local_118 = 1;
        }
      }
      else {
LAB_00415eef:
        pcVar9 = cmExecutionStatus::GetMakefile(local_20);
        bVar2 = cmMakefile::ReadDependentFile
                          (pcVar9,(string *)local_578,(bool)(fname.field_2._M_local_buf[0xd] & 1));
        uVar8 = std::__cxx11::string::empty();
        if ((uVar8 & 1) == 0) {
          pcVar9 = cmExecutionStatus::GetMakefile(local_20);
          if (bVar2) {
            local_8b0 = (char *)std::__cxx11::string::c_str();
          }
          else {
            local_8b0 = "NOTFOUND";
          }
          std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                    ((basic_string_view<char,_std::char_traits<char>_> *)((long)&m.field_2 + 8),
                     local_8b0);
          cmMakefile::AddDefinition(pcVar9,(string *)local_e8,stack0xfffffffffffff958);
        }
        if ((((fname.field_2._M_local_buf[0xe] & 1U) != 0) || (bVar2)) ||
           (bVar2 = cmSystemTools::GetFatalErrorOccurred(), bVar2)) {
          args_local._7_1_ = 1;
          local_118 = 1;
        }
        else {
          cmAlphaNum::cmAlphaNum(&local_6f8,"could not load requested file:\n  ");
          cmAlphaNum::cmAlphaNum(&local_728,(string *)((long)&resultVarName.field_2 + 8));
          cmStrCat<>((string *)local_6c8,&local_6f8,&local_728);
          cmExecutionStatus::SetError(local_20,(string *)local_6c8);
          args_local._7_1_ = 0;
          local_118 = 1;
          std::__cxx11::string::~string((string *)local_6c8);
        }
      }
      std::__cxx11::string::~string((string *)local_578);
    }
    std::__cxx11::string::~string((string *)&gg);
  }
  else {
    pcVar9 = cmExecutionStatus::GetMakefile(local_20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_208,"include() given empty file name (ignored).",
               (allocator<char> *)(module.field_2._M_local_buf + 0xf));
    cmMakefile::IssueMessage(pcVar9,AUTHOR_WARNING,(string *)local_208);
    std::__cxx11::string::~string((string *)local_208);
    std::allocator<char>::~allocator((allocator<char> *)(module.field_2._M_local_buf + 0xf));
    args_local._7_1_ = 1;
    local_118 = 1;
  }
LAB_004160c7:
  std::__cxx11::string::~string((string *)local_e8);
  std::__cxx11::string::~string((string *)(resultVarName.field_2._M_local_buf + 8));
LAB_004160fb:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool cmIncludeCommand(std::vector<std::string> const& args,
                      cmExecutionStatus& status)
{
  static std::map<std::string, cmPolicies::PolicyID> DeprecatedModules;
  if (DeprecatedModules.empty()) {
    DeprecatedModules["Documentation"] = cmPolicies::CMP0106;
    DeprecatedModules["WriteCompilerDetectionHeader"] = cmPolicies::CMP0120;
  }

  if (args.empty() || args.size() > 4) {
    status.SetError("called with wrong number of arguments.  "
                    "include() only takes one file.");
    return false;
  }
  bool optional = false;
  bool noPolicyScope = false;
  std::string fname = args[0];
  std::string resultVarName;

  for (unsigned int i = 1; i < args.size(); i++) {
    if (args[i] == "OPTIONAL") {
      if (optional) {
        status.SetError("called with invalid arguments: OPTIONAL used twice");
        return false;
      }
      optional = true;
    } else if (args[i] == "RESULT_VARIABLE") {
      if (!resultVarName.empty()) {
        status.SetError("called with invalid arguments: "
                        "only one result variable allowed");
        return false;
      }
      if (++i < args.size()) {
        resultVarName = args[i];
      } else {
        status.SetError("called with no value for RESULT_VARIABLE.");
        return false;
      }
    } else if (args[i] == "NO_POLICY_SCOPE") {
      noPolicyScope = true;
    } else if (i > 1) // compat.: in previous cmake versions the second
                      // parameter was ignored if it wasn't "OPTIONAL"
    {
      std::string errorText =
        cmStrCat("called with invalid argument: ", args[i]);
      status.SetError(errorText);
      return false;
    }
  }

  if (fname.empty()) {
    status.GetMakefile().IssueMessage(
      MessageType::AUTHOR_WARNING,
      "include() given empty file name (ignored).");
    return true;
  }

  if (!cmSystemTools::FileIsFullPath(fname)) {
    bool system = false;
    // Not a path. Maybe module.
    std::string module = cmStrCat(fname, ".cmake");
    std::string mfile = status.GetMakefile().GetModulesFile(module, system);

    if (system) {
      auto ModulePolicy = DeprecatedModules.find(fname);
      if (ModulePolicy != DeprecatedModules.end()) {
        cmPolicies::PolicyStatus PolicyStatus =
          status.GetMakefile().GetPolicyStatus(ModulePolicy->second);
        switch (PolicyStatus) {
          case cmPolicies::WARN: {
            status.GetMakefile().IssueMessage(
              MessageType::AUTHOR_WARNING,
              cmStrCat(cmPolicies::GetPolicyWarning(ModulePolicy->second),
                       "\n"));
            CM_FALLTHROUGH;
          }
          case cmPolicies::OLD:
            break;
          case cmPolicies::REQUIRED_IF_USED:
          case cmPolicies::REQUIRED_ALWAYS:
          case cmPolicies::NEW:
            mfile = "";
            break;
        }
      }
    }

    if (!mfile.empty()) {
      fname = mfile;
    }
  }

  std::string fname_abs = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  cmGlobalGenerator* gg = status.GetMakefile().GetGlobalGenerator();
  if (gg->IsExportedTargetsFile(fname_abs)) {
    const char* modal = nullptr;
    std::ostringstream e;
    MessageType messageType = MessageType::AUTHOR_WARNING;

    switch (status.GetMakefile().GetPolicyStatus(cmPolicies::CMP0024)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0024) << "\n";
        modal = "should";
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
      case cmPolicies::NEW:
        modal = "may";
        messageType = MessageType::FATAL_ERROR;
    }
    if (modal) {
      e << "The file\n  " << fname_abs
        << "\nwas generated by the export() "
           "command.  It "
        << modal
        << " not be used as the argument to the "
           "include() command.  Use ALIAS targets instead to refer to targets "
           "by alternative names.\n";
      status.GetMakefile().IssueMessage(messageType, e.str());
      if (messageType == MessageType::FATAL_ERROR) {
        return false;
      }
    }
    gg->CreateGenerationObjects();
    gg->GenerateImportFile(fname_abs);
  }

  std::string listFile = cmSystemTools::CollapseFullPath(
    fname, status.GetMakefile().GetCurrentSourceDirectory());

  const bool fileDoesnotExist = !cmSystemTools::FileExists(listFile);
  const bool fileIsDirectory = cmSystemTools::FileIsDirectory(listFile);
  if (fileDoesnotExist || fileIsDirectory) {
    if (!resultVarName.empty()) {
      status.GetMakefile().AddDefinition(resultVarName, "NOTFOUND");
    }
    if (optional) {
      return true;
    }
    if (fileDoesnotExist) {
      status.SetError(cmStrCat("could not find requested file:\n  ", fname));
      return false;
    }
    if (fileIsDirectory) {
      status.SetError(cmStrCat("requested file is a directory:\n  ", fname));
      return false;
    }
  }

  bool readit =
    status.GetMakefile().ReadDependentFile(listFile, noPolicyScope);

  // add the location of the included file if a result variable was given
  if (!resultVarName.empty()) {
    status.GetMakefile().AddDefinition(
      resultVarName, readit ? fname_abs.c_str() : "NOTFOUND");
  }

  if (!optional && !readit && !cmSystemTools::GetFatalErrorOccurred()) {
    std::string m = cmStrCat("could not load requested file:\n  ", fname);
    status.SetError(m);
    return false;
  }
  return true;
}